

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O0

int __thiscall bdNodeManager::SearchOutOfDate(bdNodeManager *this)

{
  bool bVar1;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<const_bdNodeId,_bdQueryPeer>_> local_18;
  iterator it;
  bdNodeManager *this_local;
  
  it._M_node = (_Base_ptr)this;
  std::_Rb_tree_iterator<std::pair<const_bdNodeId,_bdQueryPeer>_>::_Rb_tree_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::
             map<bdNodeId,_bdQueryPeer,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryPeer>_>_>
             ::begin(&this->mActivePeers);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<bdNodeId,_bdQueryPeer,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryPeer>_>_>
         ::end(&this->mActivePeers);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<const_bdNodeId,_bdQueryPeer>_>::operator++(&local_18,0);
  }
  return 1;
}

Assistant:

int bdNodeManager::SearchOutOfDate() {
#ifdef DEBUG_MGR
	std::cerr << "bdNodeManager::SearchOutOfDate()";
	std::cerr << std::endl;
#endif

	std::map<bdNodeId, bdQueryPeer>::iterator it;

	/* search for out-of-date peers */
	for (it = mActivePeers.begin(); it != mActivePeers.end(); it++) {
#if 0
		if (old) {
			addQuery(it->first);
		}
#endif
	}

	return 1;
}